

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O0

type Disa::operator*(Matrix_Dense<double,_2UL,_2UL> *matrix,Vector_Dense<double,_2UL> *vector)

{
  source_location *psVar1;
  source_location *location;
  ostream *poVar2;
  size_t sVar3;
  size_type __val;
  anon_class_16_2_64c6d03b local_190;
  function<double_(unsigned_long)> local_180;
  string local_160;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  array<double,_2UL> *local_28;
  Vector_Dense<double,_2UL> *vector_local;
  Matrix_Dense<double,_2UL,_2UL> *matrix_local;
  
  local_28 = &vector->super_array<double,_2UL>;
  vector_local = (Vector_Dense<double,_2UL> *)matrix;
  psVar1 = (source_location *)Matrix_Dense<double,_2UL,_2UL>::size_column(matrix);
  location = (source_location *)std::array<double,_2UL>::size(local_28);
  if (psVar1 != location) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_50 = &PTR_s__workspace_llm4binary_github_lic_001ee008;
    console_format_abi_cxx11_(&local_48,(Disa *)0x0,(Log_Level)&local_50,location);
    poVar2 = std::operator<<(poVar2,(string *)&local_48);
    sVar3 = Matrix_Dense<double,_2UL,_2UL>::size_row((Matrix_Dense<double,_2UL,_2UL> *)vector_local)
    ;
    std::__cxx11::to_string(&local_120,sVar3);
    std::operator+(&local_100,"Incompatible vector-matrix dimensions, ",&local_120);
    std::operator+(&local_e0,&local_100,",");
    sVar3 = Matrix_Dense<double,_2UL,_2UL>::size_column
                      ((Matrix_Dense<double,_2UL,_2UL> *)vector_local);
    std::__cxx11::to_string(&local_140,sVar3);
    std::operator+(&local_c0,&local_e0,&local_140);
    std::operator+(&local_a0,&local_c0," vs. ");
    __val = std::array<double,_2UL>::size(local_28);
    std::__cxx11::to_string(&local_160,__val);
    std::operator+(&local_80,&local_a0,&local_160);
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_48);
    exit(1);
  }
  local_190.matrix = (Matrix_Dense<double,_2UL,_2UL> *)vector_local;
  local_190.vector = (Vector_Dense<double,_2UL> *)local_28;
  std::function<double(unsigned_long)>::operator*
            ((function<double(unsigned_long)> *)&local_180,&local_190);
  sVar3 = Matrix_Dense<double,_2UL,_2UL>::size_column
                    ((Matrix_Dense<double,_2UL,_2UL> *)vector_local);
  Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)&matrix_local,&local_180,sVar3);
  std::function<double_(unsigned_long)>::~function(&local_180);
  return (array<double,_2UL>)(array<double,_2UL>)_matrix_local;
}

Assistant:

typename Static_Promoter<Vector_Dense<_type, _row>, Vector_Dense<_type, _size>>::type constexpr operator*(
const Matrix_Dense<_type, _row, _col>& matrix, const Vector_Dense<_type, _size>& vector) {
  ASSERT_DEBUG(matrix.size_column() == vector.size(),
               "Incompatible vector-matrix dimensions, " + std::to_string(matrix.size_row()) + "," +
               std::to_string(matrix.size_column()) + " vs. " + std::to_string(vector.size()));
  typedef typename Static_Promoter<Vector_Dense<_type, _row>, Vector_Dense<_type, _size>>::type _return_vector;
  return _return_vector([&](const std::size_t i_row) { return dot_product(matrix[i_row], vector); },
                        matrix.size_column());
}